

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void release_current_frame(AV1Decoder *pbi)

{
  RefCntBuffer *buf;
  long in_RDI;
  BufferPool *pool;
  AV1_COMMON *cm;
  BufferPool *pool_00;
  
  buf = (RefCntBuffer *)(in_RDI + 0x3b60);
  pool_00 = *(BufferPool **)(in_RDI + 0x9e50);
  *(undefined4 *)(*(long *)(in_RDI + 0x3c48) + 0x59c) = 1;
  lock_buffer_pool((BufferPool *)0x1c8f28);
  decrease_ref_count(buf,pool_00);
  unlock_buffer_pool((BufferPool *)0x1c8f46);
  (buf->seg).feature_mask[3] = 0;
  (buf->seg).feature_mask[4] = 0;
  return;
}

Assistant:

static void release_current_frame(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;
  BufferPool *const pool = cm->buffer_pool;

  cm->cur_frame->buf.corrupted = 1;
  lock_buffer_pool(pool);
  decrease_ref_count(cm->cur_frame, pool);
  unlock_buffer_pool(pool);
  cm->cur_frame = NULL;
}